

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

bool __thiscall wabt::WastParser::ParseRefTypeOpt(WastParser *this,Type *out_type)

{
  TokenType TVar1;
  Type TVar2;
  bool bVar3;
  Token token;
  Token TStack_58;
  
  bVar3 = false;
  TVar1 = Peek(this,0);
  if (TVar1 == First_Type) {
    Consume(&TStack_58,this);
    TVar2 = Token::type(&TStack_58);
    if ((TVar2.enum_ == ExternRef) && (this->options_[10] != (WastParseOptions)0x1)) {
      bVar3 = false;
    }
    else {
      *out_type = TVar2;
      bVar3 = true;
    }
  }
  return bVar3;
}

Assistant:

bool WastParser::ParseRefTypeOpt(Type* out_type) {
  WABT_TRACE(ParseRefTypeOpt);
  if (!PeekMatch(TokenType::ValueType)) {
    return false;
  }

  Token token = Consume();
  Type type = token.type();
  if (type == Type::ExternRef &&
      !options_->features.reference_types_enabled()) {
    return false;
  }

  *out_type = type;
  return true;
}